

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

MapValueRef * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,key_type *key)

{
  Value *ppvVar1;
  value_type *pvVar2;
  long in_RDI;
  value_type **value;
  MapKey *in_stack_00000038;
  InnerMap *in_stack_00000040;
  MapKey *in_stack_00000050;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_00000058;
  
  ppvVar1 = InnerMap::operator[](in_stack_00000040,in_stack_00000038);
  if (*ppvVar1 == (Value)0x0) {
    pvVar2 = CreateValueTypeInternal(in_stack_00000058,in_stack_00000050);
    *ppvVar1 = pvVar2;
    internal::MapValueInitializer<false,_google::protobuf::MapValueRef>::Initialize
              (&(*ppvVar1)->second,*(int *)(in_RDI + 8));
  }
  return &(*ppvVar1)->second;
}

Assistant:

T& operator[](const key_type& key) {
    value_type** value = &(*elements_)[key];
    if (*value == NULL) {
      *value = CreateValueTypeInternal(key);
      internal::MapValueInitializer<is_proto_enum<T>::value, T>::Initialize(
          (*value)->second, default_enum_value_);
    }
    return (*value)->second;
  }